

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_syntax.cpp
# Opt level: O0

ParserResult *
parse_variable_declaration
          (ParserResult *__return_storage_ptr__,ParserContext *parser,token_iterator begin,
          token_iterator end)

{
  bool bVar1;
  __shared_ptr_access<SyntaxTree,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this;
  size_t sVar2;
  SyntaxTree *this_00;
  element_type *peVar3;
  shared_ptr<SyntaxTree> *other;
  NodeType local_2fc;
  NodeType local_2f8;
  NodeType local_2f4;
  NodeType local_2f0;
  NodeType local_2ec;
  NodeType local_2e8;
  NodeType local_2e4;
  ParserStatus local_2cc;
  ParserState local_2c8;
  variant<ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_> local_270;
  ParserState local_218;
  shared_ptr<SyntaxTree> local_1c0;
  ParserSuccess local_1b0;
  pair<const_TokenStream::TokenData_*,_ParserSuccess> local_1a0;
  undefined1 local_188 [8];
  shared_ptr<SyntaxTree> tree;
  ParserState local_170;
  tuple<TokenStream::TokenData_const*&,eggs::variants::variant<ParserSuccess,llvm_vecsmall::SmallVector<ParserError,1u>>&>
  local_118 [40];
  pair<const_TokenStream::TokenData_*,_eggs::variants::variant<ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>_>
  local_f0;
  undefined1 local_90 [8];
  ParserState idents;
  TokenData *it;
  token_iterator pTStack_28;
  NodeType type;
  token_iterator end_local;
  token_iterator begin_local;
  ParserContext *parser_local;
  
  pTStack_28 = end;
  end_local = begin;
  begin_local = (token_iterator)parser;
  parser_local = (ParserContext *)__return_storage_ptr__;
  if (begin == end) {
LAB_003442de:
    local_2cc = GiveUp;
    make_error<ParserStatus,TokenStream::TokenData_const*&>(&local_2c8,&local_2cc,&end_local);
    std::
    make_pair<TokenStream::TokenData_const*&,eggs::variants::variant<ParserSuccess,llvm_vecsmall::SmallVector<ParserError,1u>>>
              (__return_storage_ptr__,&stack0xffffffffffffffd8,&local_2c8);
    eggs::variants::variant<ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>::~variant
              (&local_2c8);
    return __return_storage_ptr__;
  }
  if (begin->type == VAR_INT) {
    local_2e4 = VAR_INT;
  }
  else {
    if (begin->type == LVAR_INT) {
      local_2e8 = LVAR_INT;
    }
    else {
      if (begin->type == VAR_FLOAT) {
        local_2ec = VAR_FLOAT;
      }
      else {
        if (begin->type == LVAR_FLOAT) {
          local_2f0 = LVAR_FLOAT;
        }
        else {
          if (begin->type == VAR_TEXT_LABEL) {
            local_2f4 = VAR_TEXT_LABEL;
          }
          else {
            if (begin->type == LVAR_TEXT_LABEL) {
              local_2f8 = LVAR_TEXT_LABEL;
            }
            else {
              if (begin->type == VAR_TEXT_LABEL16) {
                local_2fc = VAR_TEXT_LABEL16;
              }
              else {
                local_2fc = Block;
                if (begin->type == LVAR_TEXT_LABEL16) {
                  local_2fc = LVAR_TEXT_LABEL16;
                }
              }
              local_2f8 = local_2fc;
            }
            local_2f4 = local_2f8;
          }
          local_2f0 = local_2f4;
        }
        local_2ec = local_2f0;
      }
      local_2e8 = local_2ec;
    }
    local_2e4 = local_2e8;
  }
  if (local_2e4 == Block) goto LAB_003442de;
  idents._storage.
  super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
  .
  super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
  ._which = (size_t)std::next<TokenStream::TokenData_const*>(begin,1);
  eggs::variants::variant<ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>::variant
            ((variant<ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_> *)local_90);
  parse_until_if<std::pair<TokenStream::TokenData_const*,eggs::variants::variant<ParserSuccess,llvm_vecsmall::SmallVector<ParserError,1u>>>(*)(ParserContext&,TokenStream::TokenData_const*,TokenStream::TokenData_const*),parse_variable_declaration(ParserContext&,TokenStream::TokenData_const*,TokenStream::TokenData_const*)::__0>
            (&local_f0,parse_identifier,begin_local,
             idents._storage.
             super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
             .
             super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
             ._which,pTStack_28);
  std::
  tie<TokenStream::TokenData_const*,eggs::variants::variant<ParserSuccess,llvm_vecsmall::SmallVector<ParserError,1u>>>
            ((TokenData **)local_118,
             (variant<ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_> *)
             &idents._storage.
              super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
              .
              super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
              ._which);
  std::
  tuple<TokenStream::TokenData_const*&,eggs::variants::variant<ParserSuccess,llvm_vecsmall::SmallVector<ParserError,1u>>&>
  ::operator=(local_118,&local_f0);
  std::
  pair<const_TokenStream::TokenData_*,_eggs::variants::variant<ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>_>
  ::~pair(&local_f0);
  if ((token_iterator)
      idents._storage.
      super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
      .
      super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
      ._which != pTStack_28) {
    if (*(int *)idents._storage.
                super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
                .
                super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
                ._which != 8) {
      __assert_fail("it->type == Token::NewLine",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/AndroidModLoader[P]gta3sc/src/parser_syntax.cpp"
                    ,0x36b,
                    "ParserResult parse_variable_declaration(ParserContext &, token_iterator, token_iterator)"
                   );
    }
    idents._storage.
    super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
    .
    super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
    ._which = idents._storage.
              super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
              .
              super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
              ._which + 0x18;
  }
  bVar1 = is<ParserSuccess,eggs::variants::variant<ParserSuccess,llvm_vecsmall::SmallVector<ParserError,1u>>>
                    ((variant<ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_> *)
                     local_90);
  if (bVar1) {
    this = (__shared_ptr_access<SyntaxTree,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
           eggs::variants::
           get<ParserSuccess,ParserSuccess,llvm_vecsmall::SmallVector<ParserError,1u>,0ul>
                     ((variant<ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_> *)
                      local_90);
    peVar3 = std::__shared_ptr_access<SyntaxTree,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(this);
    sVar2 = SyntaxTree::child_count(peVar3);
    if (sVar2 == 0) {
      tree.super___shared_ptr<SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ = 1;
      make_error<ParserStatus,TokenStream::TokenData_const*&,char_const(&)[37]>
                (&local_170,
                 (ParserStatus *)
                 ((long)&tree.super___shared_ptr<SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                         ._M_pi + 4),&end_local,
                 (char (*) [37])"expected identifier after this token");
      std::
      make_pair<TokenStream::TokenData_const*&,eggs::variants::variant<ParserSuccess,llvm_vecsmall::SmallVector<ParserError,1u>>>
                (__return_storage_ptr__,
                 (TokenData **)
                 &idents._storage.
                  super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
                  .
                  super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
                  ._which,&local_170);
      eggs::variants::variant<ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>::~variant
                (&local_170);
      tree.super___shared_ptr<SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 1;
      goto LAB_003442ba;
    }
  }
  bVar1 = is<ParserSuccess,eggs::variants::variant<ParserSuccess,llvm_vecsmall::SmallVector<ParserError,1u>>>
                    ((variant<ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_> *)
                     local_90);
  if (bVar1) {
    this_00 = (SyntaxTree *)operator_new(0x88);
    SyntaxTree::SyntaxTree
              (this_00,local_2e4,(shared_ptr<SyntaxTree::InputStream> *)&begin_local->end,end_local)
    ;
    std::shared_ptr<SyntaxTree>::shared_ptr<SyntaxTree,void>
              ((shared_ptr<SyntaxTree> *)local_188,this_00);
    peVar3 = std::__shared_ptr_access<SyntaxTree,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<SyntaxTree,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )local_188);
    other = &eggs::variants::
             get<ParserSuccess,ParserSuccess,llvm_vecsmall::SmallVector<ParserError,1u>,0ul>
                       ((variant<ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_> *)
                        local_90)->tree;
    SyntaxTree::take_childs(peVar3,other);
    std::shared_ptr<SyntaxTree>::shared_ptr(&local_1c0,(shared_ptr<SyntaxTree> *)local_188);
    ParserSuccess::ParserSuccess(&local_1b0,&local_1c0);
    std::make_pair<TokenStream::TokenData_const*&,ParserSuccess>
              (&local_1a0,
               (TokenData **)
               &idents._storage.
                super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
                .
                super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
                ._which,&local_1b0);
    std::
    pair<const_TokenStream::TokenData_*,_eggs::variants::variant<ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>_>
    ::pair<const_TokenStream::TokenData_*,_ParserSuccess,_true>(__return_storage_ptr__,&local_1a0);
    std::pair<const_TokenStream::TokenData_*,_ParserSuccess>::~pair(&local_1a0);
    ParserSuccess::~ParserSuccess(&local_1b0);
    std::shared_ptr<SyntaxTree>::~shared_ptr(&local_1c0);
    tree.super___shared_ptr<SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 1;
    std::shared_ptr<SyntaxTree>::~shared_ptr((shared_ptr<SyntaxTree> *)local_188);
  }
  else {
    eggs::variants::variant<ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>::variant
              (&local_270,
               (variant<ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_> *)local_90);
    giveup_to_expected(&local_218,&local_270,"identifier");
    std::
    make_pair<TokenStream::TokenData_const*&,eggs::variants::variant<ParserSuccess,llvm_vecsmall::SmallVector<ParserError,1u>>>
              (__return_storage_ptr__,
               (TokenData **)
               &idents._storage.
                super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
                .
                super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
                ._which,&local_218);
    eggs::variants::variant<ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>::~variant
              (&local_218);
    eggs::variants::variant<ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>::~variant
              (&local_270);
    tree.super___shared_ptr<SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 1;
  }
LAB_003442ba:
  eggs::variants::variant<ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>::~variant
            ((variant<ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_> *)local_90);
  return __return_storage_ptr__;
}

Assistant:

static ParserResult parse_variable_declaration(ParserContext& parser, token_iterator begin, token_iterator end)
{
    if(begin != end)
    {
        NodeType type = begin->type == Token::VAR_INT? NodeType::VAR_INT :
                        begin->type == Token::LVAR_INT? NodeType::LVAR_INT :
                        begin->type == Token::VAR_FLOAT? NodeType::VAR_FLOAT :
                        begin->type == Token::LVAR_FLOAT? NodeType::LVAR_FLOAT :
                        begin->type == Token::VAR_TEXT_LABEL? NodeType::VAR_TEXT_LABEL :
                        begin->type == Token::LVAR_TEXT_LABEL? NodeType::LVAR_TEXT_LABEL :
                        begin->type == Token::VAR_TEXT_LABEL16? NodeType::VAR_TEXT_LABEL16 :
                        begin->type == Token::LVAR_TEXT_LABEL16? NodeType::LVAR_TEXT_LABEL16 :
                                                                   NodeType::Block;

        if(type != NodeType::Block)
        {
            auto it = std::next(begin);
            ParserState idents;

            std::tie(it, idents) = parse_until_if(parse_identifier, parser, it, end, [](token_iterator t) {
                return t->type == Token::NewLine;
            });

            if(it != end)
            {
                assert(it->type == Token::NewLine);
                ++it;
            }

            if(is<ParserSuccess>(idents) && get<ParserSuccess>(idents).tree->child_count() == 0)
            {
                return std::make_pair(it, make_error(ParserStatus::Error, begin, "expected identifier after this token"));
            }

            if(is<ParserSuccess>(idents))
            {
                shared_ptr<SyntaxTree> tree(new SyntaxTree(type, parser.instream, *begin));
                tree->take_childs(get<ParserSuccess>(idents).tree);
                return std::make_pair(it, ParserSuccess(std::move(tree)));
            }
            else
            {
                return std::make_pair(it, giveup_to_expected(std::move(idents), "identifier"));
            }
        }
    }
    return std::make_pair(end, make_error(ParserStatus::GiveUp, begin));
}